

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.hpp
# Opt level: O2

container<unsigned_char> __thiscall pstore::repo::generic_section::payload(generic_section *this)

{
  container<unsigned_char> local_10;
  
  container<unsigned_char>::container
            (&local_10,(const_pointer)(this + 1),
             (const_pointer)((long)&this[1].field_0 + this->data_size_));
  return local_10;
}

Assistant:

container<std::uint8_t> payload () const noexcept {
                auto const * const begin = aligned_ptr<std::uint8_t> (this + 1);
                return {begin, begin + data_size_};
            }